

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void benchmark::internal::ParseCommandLineFlags(int *argc,char **argv)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  long lVar3;
  int i;
  int iVar4;
  string *local_40 [2];
  
  iVar4 = 1;
  do {
    if (*argc <= iVar4) goto LAB_00126ccf;
    lVar3 = (long)iVar4;
    bVar2 = ParseBoolFlag(argv[lVar3],"benchmark_list_tests",&FLAGS_benchmark_list_tests);
    if (bVar2) {
LAB_00126c90:
      iVar1 = *argc;
      for (; iVar1 != lVar3; lVar3 = lVar3 + 1) {
        argv[lVar3] = argv[lVar3 + 1];
      }
      *argc = iVar1 + -1;
      iVar4 = iVar4 + -1;
    }
    else {
      bVar2 = ParseStringFlag(argv[lVar3],"benchmark_filter",&FLAGS_benchmark_filter_abi_cxx11_);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseDoubleFlag(argv[lVar3],"benchmark_min_time",&FLAGS_benchmark_min_time);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseInt32Flag(argv[lVar3],"benchmark_repetitions",&FLAGS_benchmark_repetitions);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseBoolFlag(argv[lVar3],"benchmark_report_aggregates_only",
                            &FLAGS_benchmark_report_aggregates_only);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseStringFlag(argv[lVar3],"benchmark_format",&FLAGS_benchmark_format_abi_cxx11_);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseStringFlag(argv[lVar3],"benchmark_out",&FLAGS_benchmark_out_abi_cxx11_);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseStringFlag(argv[lVar3],"benchmark_out_format",
                              &FLAGS_benchmark_out_format_abi_cxx11_);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseBoolFlag(argv[lVar3],"color_print",&FLAGS_color_print);
      if (bVar2) goto LAB_00126c90;
      bVar2 = ParseInt32Flag(argv[lVar3],"v",&FLAGS_v);
      if (bVar2) goto LAB_00126c90;
      bVar2 = IsFlag(argv[lVar3],"help");
      if (bVar2) {
LAB_00126cca:
        PrintUsageAndExit();
LAB_00126ccf:
        local_40[0] = &FLAGS_benchmark_format_abi_cxx11_;
        local_40[1] = &FLAGS_benchmark_out_format_abi_cxx11_;
        lVar3 = 0;
        do {
          if (lVar3 == 0x10) {
            return;
          }
          __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   ((long)local_40 + lVar3);
          bVar2 = std::operator!=(__lhs,"console");
          if (bVar2) {
            bVar2 = std::operator!=(__lhs,"json");
            if (bVar2) {
              bVar2 = std::operator!=(__lhs,"csv");
              if (bVar2) goto LAB_00126cca;
            }
          }
          lVar3 = lVar3 + 8;
        } while( true );
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void ParseCommandLineFlags(int* argc, char** argv) {
  using namespace benchmark;
  for (int i = 1; i < *argc; ++i) {
    if (
        ParseBoolFlag(argv[i], "benchmark_list_tests",
                      &FLAGS_benchmark_list_tests) ||
        ParseStringFlag(argv[i], "benchmark_filter",
                        &FLAGS_benchmark_filter) ||
        ParseDoubleFlag(argv[i], "benchmark_min_time",
                        &FLAGS_benchmark_min_time) ||
        ParseInt32Flag(argv[i], "benchmark_repetitions",
                       &FLAGS_benchmark_repetitions) ||
        ParseBoolFlag(argv[i], "benchmark_report_aggregates_only",
                       &FLAGS_benchmark_report_aggregates_only) ||
        ParseStringFlag(argv[i], "benchmark_format",
                        &FLAGS_benchmark_format) ||
        ParseStringFlag(argv[i], "benchmark_out",
                        &FLAGS_benchmark_out) ||
        ParseStringFlag(argv[i], "benchmark_out_format",
                        &FLAGS_benchmark_out_format) ||
        ParseBoolFlag(argv[i], "color_print",
                       &FLAGS_color_print) ||
        ParseInt32Flag(argv[i], "v", &FLAGS_v)) {
      for (int j = i; j != *argc; ++j) argv[j] = argv[j + 1];

      --(*argc);
      --i;
    } else if (IsFlag(argv[i], "help")) {
      PrintUsageAndExit();
    }
  }
  for (auto const* flag : {&FLAGS_benchmark_format,
                           &FLAGS_benchmark_out_format})
  if (*flag != "console" && *flag != "json" && *flag != "csv") {
    PrintUsageAndExit();
  }
}